

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O2

OPTIONHANDLER_HANDLE
telemetry_messenger_retrieve_options(TELEMETRY_MESSENGER_HANDLE messenger_handle)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "Failed to retrieve options from messenger instance (messenger_handle is NULL)";
      iVar3 = 0x7e5;
LAB_001364ab:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_retrieve_options",iVar3,1,pcVar4);
      return (OPTIONHANDLER_HANDLE)0x0;
    }
  }
  else {
    handle = OptionHandler_Create
                       (telemetry_messenger_clone_option,telemetry_messenger_destroy_option,
                        telemetry_messenger_set_option);
    if (handle == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Failed to retrieve options from messenger instance (OptionHandler_Create failed)";
        iVar3 = 0x7ee;
        goto LAB_001364ab;
      }
    }
    else {
      OVar1 = OptionHandler_AddOption
                        (handle,"telemetry_event_send_timeout_secs",
                         &messenger_handle->event_send_timeout_secs);
      if (OVar1 == OPTIONHANDLER_OK) {
        return handle;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                  ,"telemetry_messenger_retrieve_options",0x7f7,1,
                  "Failed to retrieve options from messenger instance (OptionHandler_Create failed for option \'%s\')"
                  ,"telemetry_event_send_timeout_secs");
      }
      OptionHandler_Destroy(handle);
    }
  }
  return (OPTIONHANDLER_HANDLE)0x0;
}

Assistant:

OPTIONHANDLER_HANDLE telemetry_messenger_retrieve_options(TELEMETRY_MESSENGER_HANDLE messenger_handle)
{
    OPTIONHANDLER_HANDLE result;

    if (messenger_handle == NULL)
    {
        LogError("Failed to retrieve options from messenger instance (messenger_handle is NULL)");
        result = NULL;
    }
    else
    {
        OPTIONHANDLER_HANDLE options = OptionHandler_Create(telemetry_messenger_clone_option, telemetry_messenger_destroy_option, (pfSetOption)telemetry_messenger_set_option);

        if (options == NULL)
        {
            LogError("Failed to retrieve options from messenger instance (OptionHandler_Create failed)");
            result = NULL;
        }
        else
        {
            TELEMETRY_MESSENGER_INSTANCE* instance = (TELEMETRY_MESSENGER_INSTANCE*)messenger_handle;

            if (OptionHandler_AddOption(options, TELEMETRY_MESSENGER_OPTION_EVENT_SEND_TIMEOUT_SECS, (void*)&instance->event_send_timeout_secs) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options from messenger instance (OptionHandler_Create failed for option '%s')", TELEMETRY_MESSENGER_OPTION_EVENT_SEND_TIMEOUT_SECS);
                result = NULL;
            }
            else
            {
                result = options;
            }

            if (result == NULL)
            {
                OptionHandler_Destroy(options);
            }
        }
    }

    return result;
}